

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O1

QRect __thiscall QListViewPrivate::cellRectForIndex(QListViewPrivate *this,QModelIndex *index)

{
  Int IVar1;
  bool bVar2;
  QRect QVar3;
  
  bVar2 = hasRectForIndex(this,index);
  if (bVar2) {
    if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
       ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
      QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate);
      (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                               super_QWidgetPrivate.field_0x8 + 0x220))();
    }
    IVar1 = (this->itemAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i;
    (this->itemAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
    QVar3 = rectForIndex(this,index);
    (this->itemAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = IVar1;
  }
  else {
    QVar3 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  return QVar3;
}

Assistant:

QRect cellRectForIndex(const QModelIndex &index)
    {
        if (!hasRectForIndex(index))
            return QRect();
        executePostedLayout();
        auto oldItemAlignment = itemAlignment;
        itemAlignment = Qt::Alignment();
        const QRect rect = rectForIndex(index);
        itemAlignment = oldItemAlignment;
        return rect;
    }